

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRepr.c
# Opt level: O3

void Aig_ManReprStart(Aig_Man_t *p,int nIdMax)

{
  Aig_Obj_t **ppAVar1;
  
  if (p->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                  ,0x2f,"void Aig_ManReprStart(Aig_Man_t *, int)");
  }
  if (p->pReprs == (Aig_Obj_t **)0x0) {
    p->nReprsAlloc = nIdMax;
    ppAVar1 = (Aig_Obj_t **)calloc(1,(long)nIdMax << 3);
    p->pReprs = ppAVar1;
    return;
  }
  __assert_fail("p->pReprs == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigRepr.c"
                ,0x30,"void Aig_ManReprStart(Aig_Man_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the array of representatives.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_ManReprStart( Aig_Man_t * p, int nIdMax )
{
    assert( Aig_ManBufNum(p) == 0 );
    assert( p->pReprs == NULL );
    p->nReprsAlloc = nIdMax;
    p->pReprs = ABC_ALLOC( Aig_Obj_t *, p->nReprsAlloc );
    memset( p->pReprs, 0, sizeof(Aig_Obj_t *) * p->nReprsAlloc );
}